

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::TaskSet::~TaskSet(TaskSet *this)

{
  TaskSet *this_local;
  
  destroyTasks(this);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&this->emptyFulfiller);
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::~Maybe(&this->tasks);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

TaskSet::~TaskSet() noexcept(false) {
  destroyTasks();
}